

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

string * duckdb::StringValue::Get_abi_cxx11_(Value *value)

{
  ExtraValueInfo *this;
  StringValueInfo *pSVar1;
  InternalException *this_00;
  string local_40;
  
  if (value->is_null != true) {
    this = shared_ptr<duckdb::ExtraValueInfo,_true>::operator->(&value->value_info_);
    pSVar1 = ExtraValueInfo::Get<duckdb::StringValueInfo>(this);
    return &pSVar1->str;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Calling StringValue::Get on a NULL value","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

const string &StringValue::Get(const Value &value) {
	if (value.is_null) {
		throw InternalException("Calling StringValue::Get on a NULL value");
	}
	D_ASSERT(value.type().InternalType() == PhysicalType::VARCHAR);
	D_ASSERT(value.value_info_);
	return value.value_info_->Get<StringValueInfo>().GetString();
}